

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

TRex * trex_compile(char *pattern,char **error,int flags)

{
  int iVar1;
  TRex *exp;
  size_t sVar2;
  TRexNode *pTVar3;
  __jmp_buf_tag *__env;
  TRexMatch *__s;
  
  exp = (TRex *)malloc(0x60);
  exp->_eol = (char *)0x0;
  exp->_bol = (char *)0x0;
  exp->_p = pattern;
  sVar2 = strlen(pattern);
  exp->_nallocated = (int)sVar2;
  pTVar3 = (TRexNode *)malloc((long)(int)sVar2 << 4);
  exp->_nodes = pTVar3;
  exp->_nsize = 0;
  exp->_nsubexpr = 0;
  exp->_matches = (TRexMatch *)0x0;
  iVar1 = trex_newnode(exp,0x102);
  exp->_first = iVar1;
  exp->_error = error;
  __env = (__jmp_buf_tag *)malloc(200);
  exp->_jmpbuf = __env;
  exp->_flags = flags;
  iVar1 = _setjmp(__env);
  if (iVar1 == 0) {
    iVar1 = trex_list(exp);
    exp->_nodes[exp->_first].left = iVar1;
    if (*exp->_p != '\0') {
      if (exp->_error != (char **)0x0) {
        *exp->_error = "unexpected character";
      }
      longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
    }
    sVar2 = (long)exp->_nsubexpr << 4;
    __s = (TRexMatch *)malloc(sVar2);
    exp->_matches = __s;
    memset(__s,0,sVar2);
  }
  else {
    trex_free(exp);
    exp = (TRex *)0x0;
  }
  return exp;
}

Assistant:

TRex * trex_compile(const TRexChar * pattern, const TRexChar ** error, int flags) {
	TRex * exp = (TRex *)malloc(sizeof(TRex));
	exp->_eol = exp->_bol = NULL;
	exp->_p = pattern;
	exp->_nallocated = (int)scstrlen(pattern) * sizeof(TRexChar);
	exp->_nodes = (TRexNode *)malloc(exp->_nallocated * sizeof(TRexNode));
	exp->_nsize = 0;
	exp->_matches = 0;
	exp->_nsubexpr = 0;
	exp->_first = trex_newnode(exp, OP_EXPR);
	exp->_error = error;
	exp->_jmpbuf = malloc(sizeof(jmp_buf));
	exp->_flags = flags;

	if (setjmp(*((jmp_buf *)exp->_jmpbuf)) == 0) {
		int res = trex_list(exp);
		exp->_nodes[exp->_first].left = res;

		if (*exp->_p != '\0') {
			trex_error(exp, _SC("unexpected character"));
		}

#ifdef _DEBUG
		{
			int nsize, i;
			TRexNode * t;
			nsize = exp->_nsize;
			t = &exp->_nodes[0];
			scprintf(_SC("\n"));

			for (i = 0; i < nsize; i++) {
				if (exp->_nodes[i].type > MAX_CHAR) {
					scprintf(_SC("[%02d] %10s "), i, g_nnames[exp->_nodes[i].type - MAX_CHAR]);
				} else {
					scprintf(_SC("[%02d] %10c "), i, exp->_nodes[i].type);
				}

				scprintf(_SC("left %02d right %02d next %02d\n"), exp->_nodes[i].left, exp->_nodes[i].right, exp->_nodes[i].next);
			}

			scprintf(_SC("\n"));
		}
#endif
		exp->_matches = (TRexMatch *) malloc(exp->_nsubexpr * sizeof(TRexMatch));
		memset(exp->_matches, 0, exp->_nsubexpr * sizeof(TRexMatch));
	} else {
		trex_free(exp);
		return NULL;
	}

	return exp;
}